

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O0

void __thiscall
wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
          (CircularArray<(anonymous_namespace)::TestObject,_2UL> *this,value_type *value)

{
  size_type index;
  reference element;
  value_type *value_local;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> *this_local;
  
  if (this->size_ < 2) {
    index = this->size_;
    this->size_ = index + 1;
    element = at(this,index);
    CircularArray<(anonymous_namespace)::TestObject,2ul>::
    SetElement<(anonymous_namespace)::TestObject_const&>
              ((CircularArray<(anonymous_namespace)::TestObject,2ul> *)this,element,value);
    return;
  }
  __assert_fail("size_ < kCapacity",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/circular-array.h"
                ,0x5d,
                "void wabt::CircularArray<(anonymous namespace)::TestObject, 2>::push_back(const value_type &) [T = (anonymous namespace)::TestObject, kCapacity = 2]"
               );
}

Assistant:

void push_back(const value_type& value) {
    assert(size_ < kCapacity);
    SetElement(at(size_++), value);
  }